

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O0

float deqp::gles3::Functional::computeFloatingPointError(float value,int numAccurateBits)

{
  float fVar1;
  float fVar2;
  Float<unsigned_int,_8,_23,_127,_3U> local_28;
  Float<unsigned_int,_8,_23,_127,_3U> local_24;
  Float<unsigned_int,_8,_23,_127,_3U> local_20;
  int local_1c;
  uint local_18;
  int exp;
  deUint32 mask;
  int numGarbageBits;
  int numAccurateBits_local;
  float value_local;
  
  exp = 0x17 - numAccurateBits;
  local_18 = (1 << ((byte)exp & 0x1f)) - 1;
  mask = numAccurateBits;
  numGarbageBits = (int)value;
  tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float(&local_20,value);
  local_1c = tcu::Float<unsigned_int,_8,_23,_127,_3U>::exponent(&local_20);
  local_24 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::construct(1,local_1c,local_18 | 0x800000);
  fVar1 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::asFloat(&local_24);
  local_28 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::construct(1,local_1c,0x800000);
  fVar2 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::asFloat(&local_28);
  return fVar1 - fVar2;
}

Assistant:

float computeFloatingPointError (const float value, const int numAccurateBits)
{
	const int		numGarbageBits	= 23-numAccurateBits;
	const deUint32	mask			= (1u<<numGarbageBits)-1u;
	const int		exp				= tcu::Float32(value).exponent();

	return tcu::Float32::construct(+1, exp, (1u<<23) | mask).asFloat() - tcu::Float32::construct(+1, exp, 1u<<23).asFloat();
}